

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_core.c
# Opt level: O2

int asterism_core_run(asterism_s *as)

{
  int iVar1;
  
  iVar1 = asterism_core_prepare(as);
  if (iVar1 != 0) {
    asterism_core_stop(as);
  }
  iVar1 = uv_run(as->loop,UV_RUN_DEFAULT);
  return (int)(iVar1 != 0);
}

Assistant:

int asterism_core_run(struct asterism_s *as)
{
    int ret = ASTERISM_E_OK;

    ret = asterism_core_prepare(as);
    if (ret)
    {
        asterism_core_stop(as);
    }

    ret = uv_run(as->loop, UV_RUN_DEFAULT);
    if (ret)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
cleanup:
    return ret;
}